

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusion.cpp
# Opt level: O1

RTVector3 __thiscall RTFusion::getAccelResiduals(RTFusion *this)

{
  ulong uVar1;
  RTVector3 RVar2;
  RTQuaternion rotatedGravity;
  RTVector3 residuals;
  RTQuaternion qTemp;
  RTQuaternion fusedConjugate;
  RTQuaternion local_80;
  RTQuaternion local_70;
  RTVector3 local_60;
  RTQuaternion local_50;
  RTQuaternion local_40;
  
  RTQuaternion::RTQuaternion(&local_70);
  RTQuaternion::RTQuaternion(&local_40);
  RTQuaternion::RTQuaternion(&local_50);
  RTVector3::RTVector3(&local_60);
  local_80 = RTQuaternion::conjugate(&this->m_fusionQPose);
  RTQuaternion::operator=(&local_40,&local_80);
  local_80 = RTQuaternion::operator*(&this->m_gravity,&this->m_fusionQPose);
  RTQuaternion::operator=(&local_50,&local_80);
  local_80 = RTQuaternion::operator*(&local_40,&local_50);
  RTQuaternion::operator=(&local_70,&local_80);
  RVar2.m_data[2] = -((this->m_accel).m_data[2] - local_70.m_data[3]);
  uVar1 = CONCAT44((this->m_accel).m_data[1] - local_70.m_data[2],
                   (this->m_accel).m_data[0] - local_70.m_data[1]) ^ 0x8000000080000000;
  RVar2.m_data[0] = (RTFLOAT)(int)uVar1;
  RVar2.m_data[1] = (RTFLOAT)(int)(uVar1 >> 0x20);
  return (RTVector3)RVar2.m_data;
}

Assistant:

RTVector3 RTFusion::getAccelResiduals()
{
    RTQuaternion rotatedGravity;
    RTQuaternion fusedConjugate;
    RTQuaternion qTemp;
    RTVector3 residuals;

    //  do gravity rotation and subtraction

    // create the conjugate of the pose

    fusedConjugate = m_fusionQPose.conjugate();

    // now do the rotation - takes two steps with qTemp as the intermediate variable

    qTemp = m_gravity * m_fusionQPose;
    rotatedGravity = fusedConjugate * qTemp;

    // now adjust the measured accel and change the signs to make sense

    residuals.setX(-(m_accel.x() - rotatedGravity.x()));
    residuals.setY(-(m_accel.y() - rotatedGravity.y()));
    residuals.setZ(-(m_accel.z() - rotatedGravity.z()));
    return residuals;
}